

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

Tree * jhu::thrax::readTree(Tree *__return_storage_ptr__,string_view line)

{
  pointer pNVar1;
  IndexType IVar2;
  pointer pbVar3;
  invalid_argument *piVar4;
  char *in_RCX;
  size_t sVar5;
  char *pcVar6;
  size_type __n;
  long lVar7;
  Node *this;
  string_view line_00;
  allocator<char> local_a1;
  vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string_view line_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Sentence tokens;
  
  line_00._M_len = line._M_str;
  line_local._M_len = line._M_len;
  line_00._M_str = in_RCX;
  local_a0 = __return_storage_ptr__;
  line_local._M_str = line_00._M_len;
  split(&tokens,(thrax *)line_local._M_len,line_00);
  __n = 0;
  for (pbVar3 = tokens.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != tokens.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    __n = __n + (*pbVar3->_M_str == '(');
  }
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::vector
            (local_a0,__n,(allocator_type *)&local_98);
  this = (Node *)0x0;
  lVar7 = 0;
  pbVar3 = tokens.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar3 == tokens.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (this != (Node *)0x0) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_68,&line_local,&local_a1);
        std::operator+(&local_98,"bad tree: ",&local_68);
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_98);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&tokens.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      return local_a0;
    }
    sVar5 = pbVar3->_M_len;
    pcVar6 = pbVar3->_M_str;
    if (*pcVar6 == '(') {
      if (this == (Node *)0x0) {
        IVar2 = 0;
      }
      else {
        IVar2 = (this->span).end;
      }
      pcVar6 = pcVar6 + 1;
      sVar5 = sVar5 - 1;
      pNVar1 = (local_a0->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pNVar1[lVar7].span.start = IVar2;
      pNVar1[lVar7].span.end = IVar2;
      pNVar1[lVar7].label._M_len = sVar5;
      pNVar1[lVar7].label._M_str = pcVar6;
      pNVar1[lVar7].parent = this;
      this = (local_a0->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>).
             _M_impl.super__Vector_impl_data._M_start + lVar7;
      lVar7 = lVar7 + 1;
    }
    else {
      if (this == (Node *)0x0) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_68,&line_local,&local_a1);
        std::operator+(&local_98,"bad tree: ",&local_68);
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_98);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      Node::add_suffix(this);
    }
    while ((sVar5 != 0 && (pcVar6[sVar5 - 1] == ')'))) {
      if (this == (pointer)0x0) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_68,&line_local,&local_a1);
        std::operator+(&local_98,"bad tree: ",&local_68);
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_98);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      this = this->parent;
      sVar5 = sVar5 - 1;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

Tree readTree(std::string_view line) {
  auto tokens = split(line);
  auto nodeCount = std::count_if(
      tokens.begin(), tokens.end(), [](auto t) { return t.front() == '('; });
  Tree result(nodeCount);
  size_t nextNodeIndex = 0;
  Node* curr = nullptr;
  for (auto t : tokens) {
    if (t.front() == '(') {
      IndexType start = curr == nullptr ? 0 : curr->span.end;
      t.remove_prefix(1);
      result[nextNodeIndex] = Node{ { start, start }, t, curr };
      curr = &result[nextNodeIndex++];
    } else {
      if (curr == nullptr) {
        throw std::invalid_argument("bad tree: " + std::string(line));
      }
      curr->add_suffix();
    }
    while (!t.empty() && t.back() == ')') {
      if (curr == nullptr) {
        throw std::invalid_argument("bad tree: " + std::string(line));
      }
      curr = curr->parent;
      t.remove_suffix(1);
    }
  }
  if (curr != nullptr) {
    // Not enough close parens
    throw std::invalid_argument("bad tree: " + std::string(line));
  }
  return result;
}